

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

bool __thiscall IPStats::LoadCdnsRecords(IPStats *this,cdns *cdns_ctx,int *err)

{
  bool bVar1;
  size_t packet_id;
  
  bVar1 = cdns::open_block(cdns_ctx,err);
  if (bVar1) {
    do {
      if ((cdns_ctx->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (cdns_ctx->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        packet_id = 0;
        do {
          SubmitCborPacket(this,cdns_ctx,packet_id);
          packet_id = packet_id + 1;
        } while (packet_id <
                 (ulong)(((long)(cdns_ctx->block).queries.
                                super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(cdns_ctx->block).queries.
                                super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
      }
      bVar1 = cdns::open_block(cdns_ctx,err);
    } while (bVar1);
  }
  return *err == -1;
}

Assistant:

bool IPStats::LoadCdnsRecords(cdns * cdns_ctx, int * err)
{
    bool ret = true;

    while (ret) {
        if (!cdns_ctx->open_block(err)) {
            ret = (*err == CBOR_END_OF_ARRAY);
            break;
        }
        for (size_t i = 0; i < cdns_ctx->block.queries.size(); i++) {
            SubmitCborPacket(cdns_ctx, i);
        }
    }
    return ret;
}